

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall Preprocessor::Init(Preprocessor *this)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  time_t tVar6;
  long *plVar7;
  ostream *poVar8;
  char *local_d40;
  char *local_d30;
  char *local_cc8;
  char *local_cb8;
  uint local_c40;
  bool eol;
  int count;
  int r;
  int write;
  int read;
  ofstream D_B;
  long local_a30;
  ofstream D_A;
  long local_830;
  ofstream P_B;
  long local_630;
  ofstream P_A;
  long local_420;
  ifstream D;
  long local_218;
  ifstream P;
  Preprocessor *this_local;
  
  std::ifstream::ifstream(&local_218);
  std::ifstream::ifstream(&local_420);
  std::ofstream::ofstream(&local_630);
  std::ofstream::ofstream(&local_830);
  std::ofstream::ofstream(&local_a30);
  std::ofstream::ofstream(&write);
  uVar5 = std::__cxx11::string::c_str();
  std::ifstream::open(&local_218,uVar5,8);
  uVar5 = std::__cxx11::string::c_str();
  std::ofstream::open(&local_630,uVar5,0x10);
  uVar5 = std::__cxx11::string::c_str();
  std::ofstream::open(&local_830,uVar5,0x10);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "Preprocessor: Unable to locate input program file at: ");
    poVar8 = std::operator<<(poVar8,(string *)this);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    std::ios::clear((long)&local_218 + *(long *)(local_218 + -0x18),0);
    exit(1);
  }
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "Preprocessor: Unable to create output program file at: ");
    poVar8 = std::operator<<(poVar8,(string *)&this->p_A_path);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    std::ios::clear((long)&local_630 + *(long *)(local_630 + -0x18),0);
    exit(1);
  }
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "Preprocessor: Unable to create output program file at: ");
    poVar8 = std::operator<<(poVar8,(string *)&this->p_B_path);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    std::ios::clear((long)&local_830 + *(long *)(local_830 + -0x18),0);
    exit(1);
  }
  r = 0;
  local_c40 = 0;
  tVar6 = time((time_t *)0x0);
  srand((uint)tVar6);
  while( true ) {
    plVar7 = (long *)std::istream::operator>>((istream *)&local_218,&r);
    bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
    if (!bVar2) break;
    bVar2 = 0x33333332 < local_c40 * -0x33333333 + 0xe6666666;
    iVar4 = rand();
    r = r - iVar4 % 1000;
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_630,r);
    if (bVar2) {
      local_cb8 = " ";
    }
    else {
      local_cb8 = "\n";
    }
    std::operator<<(poVar8,local_cb8);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_830,iVar4 % 1000);
    if (bVar2) {
      local_cc8 = " ";
    }
    else {
      local_cc8 = "\n";
    }
    std::operator<<(poVar8,local_cc8);
    local_c40 = local_c40 + 1;
  }
  std::ifstream::close();
  std::ofstream::close();
  std::ofstream::close();
  local_c40 = 0;
  uVar5 = std::__cxx11::string::c_str();
  std::ifstream::open(&local_420,uVar5,8);
  uVar5 = std::__cxx11::string::c_str();
  std::ofstream::open(&local_a30,uVar5,0x10);
  uVar5 = std::__cxx11::string::c_str();
  std::ofstream::open(&write,uVar5,0x10);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "Preprocessor: Unable to locate input data file at: ");
    poVar8 = std::operator<<(poVar8,(string *)&this->d_path);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    std::ios::clear((long)&local_420 + *(long *)(local_420 + -0x18),0);
    exit(1);
  }
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "Preprocessor: Unable to create output data file at: ");
    poVar8 = std::operator<<(poVar8,(string *)&this->d_A_path);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    std::ios::clear((long)&local_a30 + *(long *)(local_a30 + -0x18),0);
    exit(1);
  }
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "Preprocessor: Unable to create output data file at: ");
    poVar8 = std::operator<<(poVar8,(string *)&this->d_B_path);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    std::ios::clear((long)&write + *(long *)(_write + -0x18),0);
    exit(1);
  }
  while( true ) {
    plVar7 = (long *)std::istream::operator>>((istream *)&local_420,&r);
    bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
    if (!bVar2) break;
    uVar3 = local_c40 + 1;
    bVar2 = uVar3 != ((local_c40 + 1) - ((int)uVar3 >> 0x1f) & 0xfffffffe);
    iVar4 = rand();
    r = r - iVar4 % 1000;
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_a30,r);
    if (bVar2) {
      local_d30 = " ";
    }
    else {
      local_d30 = "\n";
    }
    std::operator<<(poVar8,local_d30);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&write,iVar4 % 1000);
    if (bVar2) {
      local_d40 = " ";
    }
    else {
      local_d40 = "\n";
    }
    std::operator<<(poVar8,local_d40);
    local_c40 = uVar3;
  }
  std::ifstream::close();
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::~ofstream(&write);
  std::ofstream::~ofstream(&local_a30);
  std::ofstream::~ofstream(&local_830);
  std::ofstream::~ofstream(&local_630);
  std::ifstream::~ifstream(&local_420);
  std::ifstream::~ifstream(&local_218);
  return;
}

Assistant:

void Preprocessor::Init()
{
  std::ifstream P, D;
  std::ofstream P_A, P_B, D_A, D_B;
  P.open(p_path.c_str());
  P_A.open(p_A_path.c_str());
  P_B.open(p_B_path.c_str());

  if (P.fail())
  {
    std::cout << "Preprocessor: Unable to locate input program file at: "<<p_path<<std::endl;
    P.clear();
    exit(1);
  }
  if (P_A.fail())
  {
    std::cout << "Preprocessor: Unable to create output program file at: "<<p_A_path<<std::endl;
    P_A.clear();
    exit(1);
  }
  if (P_B.fail())
  {
    std::cout << "Preprocessor: Unable to create output program file at: "<<p_B_path<<std::endl;
    P_B.clear();
    exit(1);
  }

  int read = 0, write = 0;
  int r = 0;
  int count = 0;
  bool eol = 0;
  srand(time(NULL));

  while (P >> read)
  {
    eol = ++count % 5;
    r = rand() % S_PARAM;
    read = read - r;
    P_A << read << ((eol == 0) ? "\n" : " ");
    P_B << r << ((eol == 0) ? "\n" : " ");
  }
  P.close();
  P_A.close();
  P_B.close();

  count = 0;
  eol = 0;
  D.open(d_path.c_str());
  D_A.open(d_A_path.c_str());
  D_B.open(d_B_path.c_str());
  
  if (D.fail())
  {
    std::cout << "Preprocessor: Unable to locate input data file at: "<<d_path<<std::endl;
    D.clear();
    exit(1);
  }
  if (D_A.fail())
  {
    std::cout << "Preprocessor: Unable to create output data file at: "<<d_A_path<<std::endl;
    D_A.clear();
    exit(1);
  }
  if (D_B.fail())
  {
    std::cout << "Preprocessor: Unable to create output data file at: "<<d_B_path<<std::endl;
    D_B.clear();
    exit(1);
  }
  
  while (D >> read)
  {
    eol = ++count % 2;
    r = rand() % S_PARAM;
    read = read - r;
    D_A << read << ((eol == 0) ? "\n" : " ");
    D_B << r << ((eol == 0) ? "\n" : " ");
  }
  D.close();
  D_A.close();
  D_B.close();
}